

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

int __thiscall deqp::BlockSingleStructCase::init(BlockSingleStructCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  UniformBlock *this_00;
  BlockSingleStructCase *extraout_RAX;
  VarType local_e8;
  Uniform local_d0;
  UniformBlock *local_90;
  UniformBlock *block;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockSingleStructCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = ub::ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,"S");
  local_18 = pSVar1;
  ub::VarType::VarType(&local_30,TYPE_INT_VEC3,4);
  ub::StructType::addMember(pSVar1,"a",&local_30,0xc00);
  ub::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  ub::VarType::VarType(&local_70,TYPE_FLOAT_MAT3,2);
  ub::VarType::VarType(&local_58,&local_70,4);
  ub::StructType::addMember(pSVar1,"b",&local_58,0);
  ub::VarType::~VarType(&local_58);
  ub::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  ub::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,4);
  ub::StructType::addMember(pSVar1,"c",(VarType *)&block,0);
  ub::VarType::~VarType((VarType *)&block);
  this_00 = ub::ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,"Block");
  local_90 = this_00;
  ub::VarType::VarType(&local_e8,local_18);
  ub::Uniform::Uniform(&local_d0,"s",&local_e8,0);
  ub::UniformBlock::addUniform(this_00,&local_d0);
  ub::Uniform::~Uniform(&local_d0);
  ub::VarType::~VarType(&local_e8);
  ub::UniformBlock::setFlags(local_90,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    ub::UniformBlock::setInstanceName(local_90,"block");
    ub::UniformBlock::setArraySize(local_90,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init(void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH); // First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}